

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_20340ce::AV1UpsampledPredTest_DISABLED_Speed_Test::TestBody
          (AV1UpsampledPredTest_DISABLED_Speed_Test *this)

{
  anon_enum_8 aVar1;
  byte bVar2;
  byte bVar3;
  _func_void_macroblockd_ptr_AV1Common_ptr_int_int_mv_ptr_uchar_ptr_int_int_int_int_uchar_ptr_int_int
  *p_Var4;
  double dVar5;
  double dVar6;
  AV1UpsampledPredTest_DISABLED_Speed_Test *pAVar7;
  uint uVar8;
  ParamType *pPVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  int j;
  uint uVar14;
  _func_void_macroblockd_ptr_AV1Common_ptr_int_int_mv_ptr_uchar_ptr_int_int_int_int_uchar_ptr_int_int
  **pp_Var15;
  double local_90;
  double local_88 [2];
  AV1UpsampledPredTest_DISABLED_Speed_Test *local_78;
  double local_70;
  ulong local_68;
  _func_void_macroblockd_ptr_AV1Common_ptr_int_int_mv_ptr_uchar_ptr_int_int_int_int_uchar_ptr_int_int
  *local_60;
  timeval local_58;
  timeval local_48;
  _func_void_macroblockd_ptr_AV1Common_ptr_int_int_mv_ptr_uchar_ptr_int_int_int_int_uchar_ptr_int_int
  *local_38;
  
  local_78 = this;
  pPVar9 = testing::
           WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  p_Var4 = (pPVar9->
           super__Tuple_impl<0UL,_void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>
           ).
           super__Head_base<0UL,_void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_false>
           ._M_head_impl;
  pPVar9 = testing::
           WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
           ::GetParam();
  pAVar7 = local_78;
  aVar1 = (pPVar9->
          super__Tuple_impl<0UL,_void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>
          ).super__Tuple_impl<1UL,_BLOCK_SIZE>.super__Head_base<1UL,_BLOCK_SIZE,_false>._M_head_impl
  ;
  bVar2 = ::block_size_wide[aVar1];
  bVar3 = ::block_size_high[aVar1];
  uVar10 = 1000000000 / (ulong)((uint)bVar3 + (uint)bVar2);
  pp_Var15 = &local_38;
  local_38 = aom_upsampled_pred_c;
  pdVar12 = local_88;
  local_88[0] = 0.0;
  local_90 = 0.0;
  uVar8 = (uint)uVar10;
  local_70 = (double)uVar8;
  uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
  local_60 = p_Var4;
  do {
    local_68 = uVar10;
    gettimeofday(&local_58,(__timezone_ptr_t)0x0);
    p_Var4 = *pp_Var15;
    uVar14 = 0;
    do {
      (*p_Var4)((macroblockd *)0x0,(AV1Common *)0x0,0,0,(mv *)0x0,
                (pAVar7->super_AV1UpsampledPredTest).super_AV1CompMaskPredBase.comp_pred1_,
                (uint)bVar2,(uint)bVar3,3,4,
                (pAVar7->super_AV1UpsampledPredTest).super_AV1CompMaskPredBase.ref_,0x80,3);
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar8);
    gettimeofday(&local_48,(__timezone_ptr_t)0x0);
    dVar5 = local_90;
    lVar11 = local_48.tv_usec - local_58.tv_usec;
    lVar13 = lVar11 + 1000000;
    if (-1 < lVar11) {
      lVar13 = lVar11;
    }
    *pdVar12 = ((double)(((lVar11 >> 0x3f) + (local_48.tv_sec - local_58.tv_sec)) * 1000000 + lVar13
                        ) * 1000.0) / local_70;
    dVar6 = local_88[0];
    pdVar12 = &local_90;
    pp_Var15 = &local_60;
    uVar10 = 0;
  } while ((local_68 & 1) != 0);
  printf("UpsampledPred[%d] %3dx%-3d:%7.2f/%7.2fns",1,(ulong)bVar2,(ulong)bVar3);
  printf("(%3.2f)\n",dVar6 / dVar5);
  return;
}

Assistant:

TEST_P(AV1UpsampledPredTest, DISABLED_Speed) {
  RunSpeedTest(GET_PARAM(0), GET_PARAM(1), 1);
}